

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_util.c
# Opt level: O0

char * archive_version_details(void)

{
  char *__s;
  size_t sVar1;
  char *local_18;
  char *sep;
  char *p;
  
  if (archive_version_details::init == 0) {
    archive_version_details::str.s = (char *)0x0;
    archive_version_details::str.length = 0;
    archive_version_details::str.buffer_length = 0;
    archive_strcat(&archive_version_details::str,"libarchive 3.1.2");
    archive_strcat(&archive_version_details::str," zlib/");
    archive_strcat(&archive_version_details::str,"1.2.3");
    archive_strcat(&archive_version_details::str," liblzma/");
    archive_strcat(&archive_version_details::str,"5.0.5");
    __s = BZ2_bzlibVersion();
    local_18 = strchr(__s,0x2c);
    if (local_18 == (char *)0x0) {
      sVar1 = strlen(__s);
      local_18 = __s + sVar1;
    }
    archive_strcat(&archive_version_details::str," bz2lib/");
    archive_strncat(&archive_version_details::str,__s,(long)local_18 - (long)__s);
  }
  return archive_version_details::str.s;
}

Assistant:

const char *
archive_version_details(void)
{
	static struct archive_string str;
	static int init = 0;

	if (!init) {
		archive_string_init(&str);

		archive_strcat(&str, ARCHIVE_VERSION_STRING);
#ifdef HAVE_ZLIB_H
		archive_strcat(&str, " zlib/");
		archive_strcat(&str, ZLIB_VERSION);
#endif
#ifdef HAVE_LZMA_H
		archive_strcat(&str, " liblzma/");
		archive_strcat(&str, LZMA_VERSION_STRING);
#endif
#ifdef HAVE_BZLIB_H
		{
			const char *p = BZ2_bzlibVersion();
			const char *sep = strchr(p, ',');
			if (sep == NULL)
				sep = p + strlen(p);
			archive_strcat(&str, " bz2lib/");
			archive_strncat(&str, p, sep - p);
		}
#endif
#if defined(HAVE_LZ4_H) && defined(HAVE_LIBLZ4)
		archive_string_sprintf(&str, " liblz4/%d.%d.%d",
		    LZ4_VERSION_MAJOR, LZ4_VERSION_MINOR, LZ4_VERSION_RELEASE);
#endif
	}
	return str.s;
}